

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadMicroStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,MicroString *str,Arena *arena)

{
  void *pvVar1;
  LargeRepKind LVar2;
  LargeRep *pLVar3;
  long lVar4;
  MicroRep *pMVar5;
  StringRep *r;
  ulong size_00;
  ulong local_70;
  anon_class_8_1_6b2701bd local_68;
  anon_class_24_3_c2b06966 local_60;
  char *local_48;
  int local_3c [5];
  
  local_60.ptr = &local_48;
  local_60.size = local_3c;
  size_00 = (ulong)size;
  local_68.setter = &local_60;
  pvVar1 = str->rep_;
  local_70 = size_00;
  local_60.this = this;
  local_48 = ptr;
  local_3c[0] = size;
  if (((ulong)pvVar1 & 3) == 0) {
    if (7 < (uint)size) goto LAB_00fa63b8;
  }
  else {
    if (((ulong)pvVar1 & 2) == 0) {
      if (((ulong)pvVar1 & 1) != 0) {
        LVar2 = MicroString::large_rep_kind(str);
        if (LVar2 == kString) {
          r = MicroString::string_rep(str);
          goto LAB_00fa64d7;
        }
        if ((LVar2 == kOwned) && (pLVar3 = MicroString::large_rep(str), size_00 <= pLVar3->capacity)
           ) {
          MicroString::LargeRep::owned_head(pLVar3);
          lVar4 = MicroString::
                  SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                  ::anon_class_16_2_90f187bb::operator()
                            ((anon_class_16_2_90f187bb *)&local_60,(char *)&local_70);
          MicroString::LargeRep::owned_head(pLVar3);
          MicroString::LargeRep::owned_head(pLVar3);
          pLVar3->size = (uint32_t)lVar4;
          return local_48;
        }
      }
    }
    else {
      pMVar5 = MicroString::micro_rep(str);
      if (size_00 <= pMVar5->capacity) {
        lVar4 = MicroString::
                SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                ::anon_class_16_2_90f187bb::operator()
                          ((anon_class_16_2_90f187bb *)&local_60,(char *)&local_70);
        pMVar5->size = (uint8_t)lVar4;
        return local_48;
      }
    }
LAB_00fa63b8:
    if ((arena == (Arena *)0x0) && (((ulong)str->rep_ & 3) != 0)) {
      MicroString::DestroySlow(str);
    }
    if (7 < (uint)size) {
      if ((uint)size < 0x100) {
        pMVar5 = MicroString::AllocateMicroRep(str,size_00,arena);
        if (size_00 <= pMVar5->capacity) {
          lVar4 = MicroString::
                  SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                  ::anon_class_16_2_90f187bb::operator()
                            ((anon_class_16_2_90f187bb *)&local_60,(char *)&local_70);
          pMVar5->size = (uint8_t)lVar4;
          return local_48;
        }
        ReadMicroStringFallback();
      }
      else {
        if (50000000 < (uint)size) {
          r = MicroString::AllocateStringRep(str,arena);
LAB_00fa64d7:
          MicroString::
          SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
          ::anon_class_8_1_6b2701bd::operator()(&local_68,r);
          return local_48;
        }
        pLVar3 = MicroString::AllocateOwnedRep(str,size_00,arena);
        if (size_00 <= pLVar3->capacity) {
          MicroString::LargeRep::owned_head(pLVar3);
          lVar4 = MicroString::
                  SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
                  ::anon_class_16_2_90f187bb::operator()
                            ((anon_class_16_2_90f187bb *)&local_60,(char *)&local_70);
          MicroString::LargeRep::owned_head(pLVar3);
          MicroString::LargeRep::owned_head(pLVar3);
          pLVar3->size = (uint32_t)lVar4;
          return local_48;
        }
      }
      ReadMicroStringFallback();
      goto LAB_00fa6513;
    }
    *(undefined1 *)&str->rep_ = 0;
  }
  MicroString::inline_head(str);
  lVar4 = MicroString::
          SetInChunks<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc:711:32)>
          ::anon_class_16_2_90f187bb::operator()
                    ((anon_class_16_2_90f187bb *)&local_60,(char *)&local_70);
  if ((ulong)(lVar4 << 2) < 0x100) {
    str->rep_ = (void *)((ulong)str->rep_ & 0xffffffffffffff00 | lVar4 << 2);
    return local_48;
  }
LAB_00fa6513:
  protobuf_assumption_failed
            ("size <= 0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
             ,0x171);
}

Assistant:

const char* EpsCopyInputStream::ReadMicroStringFallback(const char* ptr,
                                                        int size,
                                                        MicroString& str,
                                                        Arena* arena) {
  str.SetInChunks(size, arena, [&](auto append) {
    ptr = AppendSize(ptr, size, [&](const char* p, int s) {
      append(absl::string_view(p, s));
    });
  });
  return ptr;
}